

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::print_collection_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,Collection *coll,uint32_t indent)

{
  bool bVar1;
  size_t sVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  const_reference pvVar3;
  long lVar4;
  value_type *pvVar5;
  value_type *pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e60;
  ListEditQual local_e3c;
  string local_e38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e18;
  ListEditQual local_df4;
  string local_df0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd0;
  string local_db0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d90;
  string local_d70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d50;
  allocator local_d29;
  undefined1 local_d28 [8];
  string prefix;
  CollectionInstance instance;
  string name;
  size_t i;
  ordered_dict<tinyusdz::CollectionInstance> *local_1b8;
  ordered_dict<tinyusdz::CollectionInstance> *instances;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint32_t local_1c;
  tinyusdz *ptStack_18;
  uint32_t indent_local;
  Collection *coll_local;
  
  local_1c = (uint32_t)coll;
  ptStack_18 = this;
  coll_local = (Collection *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  if (ptStack_18 == (tinyusdz *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    instances._4_4_ = 1;
  }
  else {
    Collection::instances((ordered_dict<tinyusdz::CollectionInstance> *)&i,(Collection *)ptStack_18)
    ;
    local_1b8 = (ordered_dict<tinyusdz::CollectionInstance> *)&i;
    for (name.field_2._8_8_ = 0; sVar2 = ordered_dict<tinyusdz::CollectionInstance>::size(local_1b8)
        , (ulong)name.field_2._8_8_ < sVar2; name.field_2._8_8_ = name.field_2._8_8_ + 1) {
      this_00 = ordered_dict<tinyusdz::CollectionInstance>::keys_abi_cxx11_(local_1b8);
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](this_00,name.field_2._8_8_);
      std::__cxx11::string::string
                ((string *)((long)&instance.excludes.contained + 0x300),(string *)pvVar3);
      CollectionInstance::CollectionInstance((CollectionInstance *)((long)&prefix.field_2 + 8));
      bVar1 = ordered_dict<tinyusdz::CollectionInstance>::at
                        (local_1b8,name.field_2._8_8_,
                         (CollectionInstance *)((long)&prefix.field_2 + 8));
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_d28,"collection",&local_d29);
        std::allocator<char>::~allocator((allocator<char> *)&local_d29);
        lVar4 = std::__cxx11::string::size();
        if (lVar4 != 0) {
          std::operator+(&local_d50,":",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&instance.excludes.contained + 0x300));
          std::__cxx11::string::operator+=((string *)local_d28,(string *)&local_d50);
          std::__cxx11::string::~string((string *)&local_d50);
        }
        bVar1 = TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>::authored
                          ((TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule>
                            *)((long)&prefix.field_2 + 8));
        if (bVar1) {
          std::operator+(&local_d90,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d28,":expansionRule");
          print_typed_token_attr<tinyusdz::CollectionInstance::ExpansionRule>
                    (&local_d70,
                     (TypedAttributeWithFallback<tinyusdz::CollectionInstance::ExpansionRule> *)
                     ((long)&prefix.field_2 + 8),&local_d90,local_1c);
          std::operator<<(aoStack_198,(string *)&local_d70);
          std::__cxx11::string::~string((string *)&local_d70);
          std::__cxx11::string::~string((string *)&local_d90);
        }
        bVar1 = TypedAttributeWithFallback<tinyusdz::Animatable<bool>_>::authored
                          ((TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)
                           &instance.expansionRule._blocked);
        if (bVar1) {
          std::operator+(&local_dd0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d28,":includeRoot");
          print_typed_attr<bool>
                    (&local_db0,
                     (TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)
                     &instance.expansionRule._blocked,&local_dd0,local_1c);
          std::operator<<(aoStack_198,(string *)&local_db0);
          std::__cxx11::string::~string((string *)&local_db0);
          std::__cxx11::string::~string((string *)&local_dd0);
        }
        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                          ((optional *)&instance.includeRoot._blocked);
        if (bVar1) {
          pvVar5 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                             ((optional<tinyusdz::Relationship> *)&instance.includeRoot._blocked);
          pvVar6 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                             ((optional<tinyusdz::Relationship> *)&instance.includeRoot._blocked);
          local_df4 = Relationship::get_listedit_qual(pvVar6);
          std::operator+(&local_e18,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d28,":includes");
          anon_unknown_173::print_relationship
                    (&local_df0,pvVar5,&local_df4,false,&local_e18,local_1c);
          std::operator<<(aoStack_198,(string *)&local_df0);
          std::__cxx11::string::~string((string *)&local_df0);
          std::__cxx11::string::~string((string *)&local_e18);
        }
        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                          ((optional *)((long)&instance.includes.contained + 0x300));
        if (bVar1) {
          pvVar5 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                             ((optional<tinyusdz::Relationship> *)
                              ((long)&instance.includes.contained + 0x300));
          pvVar6 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                             ((optional<tinyusdz::Relationship> *)
                              ((long)&instance.includes.contained + 0x300));
          local_e3c = Relationship::get_listedit_qual(pvVar6);
          std::operator+(&local_e60,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d28,":excludes");
          anon_unknown_173::print_relationship
                    (&local_e38,pvVar5,&local_e3c,false,&local_e60,local_1c);
          std::operator<<(aoStack_198,(string *)&local_e38);
          std::__cxx11::string::~string((string *)&local_e38);
          std::__cxx11::string::~string((string *)&local_e60);
        }
        std::__cxx11::string::~string((string *)local_d28);
        instances._4_4_ = 0;
      }
      else {
        instances._4_4_ = 4;
      }
      CollectionInstance::~CollectionInstance((CollectionInstance *)((long)&prefix.field_2 + 8));
      std::__cxx11::string::~string((string *)((long)&instance.excludes.contained + 0x300));
    }
    std::__cxx11::stringstream::str();
    instances._4_4_ = 1;
    ordered_dict<tinyusdz::CollectionInstance>::~ordered_dict
              ((ordered_dict<tinyusdz::CollectionInstance> *)&i);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_collection(const Collection *coll, const uint32_t indent) {
  std::stringstream ss;

  if (!coll) {
    return std::string();
  }

  const auto &instances = coll->instances();

  for (size_t i = 0; i < instances.size(); i++) {
    std::string name = instances.keys()[i];

    CollectionInstance instance;
    if (!instances.at(i, &instance)) {
      continue;
    }

    std::string prefix = "collection";
    if (name.size()) {
      prefix += ":" + name;
    }

    if (instance.expansionRule.authored()) {
      ss << print_typed_token_attr(instance.expansionRule, prefix + ":expansionRule", indent);

    }


    if (instance.includeRoot.authored()) {
      ss << print_typed_attr(instance.includeRoot, prefix + ":includeRoot", indent);
    }

    if (instance.includes) {
      ss << print_relationship(
          instance.includes.value(),
          instance.includes.value().get_listedit_qual(),
          /* custom */ false, prefix + ":includes", indent);
        
    }

    if (instance.excludes) {
      ss << print_relationship(
          instance.excludes.value(),
          instance.excludes.value().get_listedit_qual(),
          /* custom */ false, prefix + ":excludes", indent);
        
    }
  }

  return ss.str();
}